

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_text64
               (sqlite3_context *pCtx,char *z,sqlite3_uint64 n,_func_void_void_ptr *xDel,uchar enc)

{
  undefined1 local_29;
  uchar enc_local;
  _func_void_void_ptr *xDel_local;
  sqlite3_uint64 n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  local_29 = enc;
  if (enc == '\x04') {
    local_29 = '\x02';
  }
  if (n < 0x80000000) {
    setResultStrOrError(pCtx,z,(int)n,local_29,xDel);
  }
  else {
    invokeValueDestructor(z,xDel,pCtx);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_text64(
  sqlite3_context *pCtx,
  const char *z,
  sqlite3_uint64 n,
  void (*xDel)(void *),
  unsigned char enc
){
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  assert( xDel!=SQLITE_DYNAMIC );
  if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, enc, xDel);
  }
}